

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::update_gauge(torrent *this)

{
  uint uVar1;
  int c;
  uint uVar2;
  
  c = current_stats_state(this);
  uVar1 = c - 0xd3;
  uVar2 = *(uint *)&this->field_0x600 >> 1 & 0xf;
  if (uVar1 != uVar2) {
    if (uVar2 != 0xf) {
      inc_stats_counter(this,uVar2 + 0xd3,-1);
    }
    if (uVar1 != 0xf) {
      inc_stats_counter(this,c,1);
    }
    *(uint *)&this->field_0x600 = (*(uint *)&this->field_0x600 & 0xffffffe1) + (uVar1 & 0xf) * 2;
  }
  return;
}

Assistant:

void torrent::update_gauge()
	{
		int const new_gauge_state = current_stats_state() - counters::num_checking_torrents;
		TORRENT_ASSERT(new_gauge_state >= 0);
		TORRENT_ASSERT(new_gauge_state <= no_gauge_state);

		if (new_gauge_state == int(m_current_gauge_state)) return;

		if (m_current_gauge_state != no_gauge_state)
			inc_stats_counter(m_current_gauge_state + counters::num_checking_torrents, -1);
		if (new_gauge_state != no_gauge_state)
			inc_stats_counter(new_gauge_state + counters::num_checking_torrents, 1);

		TORRENT_ASSERT(new_gauge_state >= 0);
		TORRENT_ASSERT(new_gauge_state <= no_gauge_state);
		m_current_gauge_state = static_cast<std::uint32_t>(new_gauge_state);
	}